

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O3

void __thiscall JUnitTestOutput::writeProperties(JUnitTestOutput *this)

{
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_20,"<properties>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_20,"</properties>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x1a])(this,&local_20);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

void JUnitTestOutput::writeProperties()
{
    writeToFile("<properties>\n");
    writeToFile("</properties>\n");
}